

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

bool __thiscall QFileDialogPrivate::restoreFromSettings(QFileDialogPrivate *this)

{
  QLatin1StringView str;
  bool bVar1;
  int iVar2;
  QFileDialog *pQVar3;
  QFileDialogPrivate *this_00;
  ulong uVar4;
  Type *pTVar5;
  char *pcVar6;
  bool *pbVar7;
  QString *pQVar8;
  QAnyStringView *this_01;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *urlStr;
  QStringList *__range1;
  int viewMode;
  QMetaEnum *viewModeMeta;
  QFileDialog *q;
  QUrl url;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList urlStrings;
  QStringList history;
  bool ok;
  QByteArray viewModeStr;
  QSettings settings;
  undefined4 in_stack_fffffffffffffbe8;
  ViewMode in_stack_fffffffffffffbec;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  QUrl *in_stack_fffffffffffffbf8;
  QAnyStringView *in_stack_fffffffffffffc00;
  char16_t *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc60;
  QStringList *history_00;
  bool local_321;
  char local_2b0 [40];
  QUrl local_288;
  QString *local_280;
  const_iterator local_278;
  const_iterator local_270 [3];
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [31];
  undefined1 local_1b9;
  undefined1 local_1b8 [3] [16];
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  QUrl local_158;
  QStringList local_150;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  undefined1 *local_f8;
  undefined1 *local_f0;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00);
  QString::QString((QString *)0x75cac5);
  QSettings::QSettings
            ((QSettings *)&local_f8,UserScope,(QString *)local_110,(QString *)local_128,
             (QObject *)0x0);
  QString::~QString((QString *)0x75caf6);
  QString::~QString((QString *)0x75cb03);
  QSettings::childGroups();
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffbf8,
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  str.m_data = (char *)in_stack_fffffffffffffc08;
  str.m_size = (qsizetype)in_stack_fffffffffffffc00;
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),str,
                     CaseInsensitive);
  QList<QString>::~QList((QList<QString> *)0x75cb71);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    history_00 = &local_150;
    this_00 = (QFileDialogPrivate *)std::data<char_const,11ul>((char (*) [11])0xb2ef0d);
    QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x75cbe7);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    QSettings::beginGroup((QAnyStringView *)&local_f8);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::operator()
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    uVar4 = QUrl::isEmpty();
    bVar1 = (uVar4 & 1) != 0;
    if (bVar1) {
      in_stack_fffffffffffffc60 = std::data<char_const,12ul>((char (*) [12])0xb2f05f);
      QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x75cc9c);
      QAnyStringView::QAnyStringView<char,_true>
                (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                 CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      QSettings::value((QAnyStringView *)&local_28);
      ::QVariant::toUrl();
    }
    else {
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                           *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      QUrl::QUrl(&local_158,(QUrl *)pTVar5);
    }
    QFileDialog::setDirectoryUrl((QFileDialog *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8)
    ;
    QUrl::~QUrl(&local_158);
    if (bVar1) {
      ::QVariant::~QVariant(&local_28);
    }
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    std::data<char_const,9ul>((char (*) [9])"viewMode");
    QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x75cdc1);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    QSettings::value((QAnyStringView *)&local_48);
    ::QVariant::toString();
    QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QString::~QString((QString *)0x75ce2f);
    ::QVariant::~QVariant(&local_48);
    iVar2 = (*(code *)**(undefined8 **)&(pQVar3->super_QDialog).super_QWidget)();
    pcVar6 = (char *)(*(code *)**(undefined8 **)&(pQVar3->super_QDialog).super_QWidget)();
    QMetaObject::indexOfEnumerator(pcVar6);
    local_1b8[0] = QMetaObject::enumerator(iVar2);
    local_1b9 = 0;
    pbVar7 = (bool *)QByteArray::constData((QByteArray *)0x75ceca);
    QMetaEnum::keyToValue((char *)local_1b8,pbVar7);
    QFileDialog::setViewMode
              ((QFileDialog *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbec);
    std::data<char_const,10ul>((char (*) [10])"shortcuts");
    QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])0x75cf5a);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    QSettings::value((QAnyStringView *)&local_68);
    ::QVariant::toStringList();
    QUrl::fromStringList((QList_conflict2 *)local_1d8,(ParsingMode)local_1f0);
    QList<QUrl>::operator=
              ((QList<QUrl> *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (QList<QUrl> *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QList<QUrl>::~QList((QList<QUrl> *)0x75cfe6);
    QList<QString>::~QList((QList<QString> *)0x75cff3);
    ::QVariant::~QVariant(&local_68);
    std::data<char_const,15ul>((char (*) [15])"treeViewHeader");
    QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])0x75d04b);
    QAnyStringView::QAnyStringView<char,_true>
              (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    QSettings::value((QAnyStringView *)&local_88);
    ::QVariant::toByteArray();
    QByteArray::operator=
              ((QByteArray *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (QByteArray *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    QByteArray::~QByteArray((QByteArray *)0x75d0c0);
    ::QVariant::~QVariant(&local_88);
    bVar1 = usingWidgets((QFileDialogPrivate *)
                         CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    if (bVar1) {
      local_240 = &DAT_aaaaaaaaaaaaaaaa;
      local_238 = &DAT_aaaaaaaaaaaaaaaa;
      local_230 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x75d130);
      local_258 = &DAT_aaaaaaaaaaaaaaaa;
      local_250 = &DAT_aaaaaaaaaaaaaaaa;
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      std::data<char_const,8ul>((char (*) [8])"history");
      QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])0x75d1a8);
      QAnyStringView::QAnyStringView<char,_true>
                (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
                 CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      QSettings::value((QAnyStringView *)&local_a8);
      ::QVariant::toStringList();
      ::QVariant::~QVariant(&local_a8);
      local_270[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_270[0] = QList<QString>::begin
                               ((QList<QString> *)
                                CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      local_278.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_278 = QList<QString>::end((QList<QString> *)
                                      CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0))
      ;
      while( true ) {
        local_280 = local_278.i;
        bVar1 = QList<QString>::const_iterator::operator!=(local_270,local_278);
        iVar2 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
        if (!bVar1) break;
        pQVar8 = QList<QString>::const_iterator::operator*(local_270);
        local_288.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QUrl::QUrl(&local_288,(QString *)pQVar8,TolerantMode);
        uVar4 = QUrl::isLocalFile();
        if ((uVar4 & 1) != 0) {
          QUrl::toLocalFile();
          QList<QString>::operator<<
                    ((QList<QString> *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                     ,(rvalue_ref)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          QString::~QString((QString *)0x75d330);
        }
        QUrl::~QUrl(&local_288);
        QList<QString>::const_iterator::operator++(local_270);
      }
      pcVar6 = local_2b0;
      this_01 = (QAnyStringView *)std::data<char_const,13ul>((char (*) [13])"sidebarWidth");
      QtPrivate::lengthHelperContainer<char,13ul>((char (*) [13])0x75d39a);
      QAnyStringView::QAnyStringView<char,_true>
                (this_01,pcVar6,CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      ::QVariant::QVariant(&local_e8,-1);
      QSettings::value((QAnyStringView *)&local_c8,(QVariant *)&local_f8);
      ::QVariant::toInt((bool *)&local_c8);
      local_321 = restoreWidgetState(this_00,history_00,iVar2);
      ::QVariant::~QVariant(&local_c8);
      ::QVariant::~QVariant(&local_e8);
      QList<QString>::~QList((QList<QString> *)0x75d44e);
      QList<QString>::~QList((QList<QString> *)0x75d45b);
    }
    else {
      local_321 = true;
    }
    QByteArray::~QByteArray((QByteArray *)0x75d468);
  }
  else {
    local_321 = false;
  }
  QSettings::~QSettings((QSettings *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_321;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::restoreFromSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    if (!settings.childGroups().contains("FileDialog"_L1))
        return false;
    settings.beginGroup("FileDialog");

    q->setDirectoryUrl(lastVisitedDir()->isEmpty() ? settings.value("lastVisited").toUrl() : *lastVisitedDir());

    QByteArray viewModeStr = settings.value("viewMode").toString().toLatin1();
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    bool ok = false;
    int viewMode = viewModeMeta.keyToValue(viewModeStr.constData(), &ok);
    if (!ok)
        viewMode = QFileDialog::List;
    q->setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    sidebarUrls = QUrl::fromStringList(settings.value("shortcuts").toStringList());
    headerData = settings.value("treeViewHeader").toByteArray();

    if (!usingWidgets())
        return true;

    QStringList history;
    const auto urlStrings = settings.value("history").toStringList();
    for (const QString &urlStr : urlStrings) {
        QUrl url(urlStr);
        if (url.isLocalFile())
            history << url.toLocalFile();
    }

    return restoreWidgetState(history, settings.value("sidebarWidth", -1).toInt());
}